

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,1,0>::accumulateDerivativesImpl<true,true,true>
          (BeagleCPUImpl<double,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double derivative;
  int k;
  double sumSquared;
  double sum;
  double *outSumSquaredDerivatives_local;
  double *outSumDerivatives_local;
  double *outDerivatives_local;
  BeagleCPUImpl<double,_1,_0> *this_local;
  
  sum = 0.0;
  sumSquared = 0.0;
  for (k = 0; k < *(int *)(this + 0x14); k = k + 1) {
    dVar1 = *(double *)(*(long *)(this + 0x100) + (long)k * 8) /
            *(double *)(*(long *)(this + 0xf8) + (long)k * 8);
    outDerivatives[k] = dVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(*(long *)(this + 0x80) + (long)k * 8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = sum;
    auVar2 = vfmadd213sd_fma(auVar2,auVar4,auVar6);
    sum = auVar2._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(*(long *)(this + 0x80) + (long)k * 8);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = sumSquared;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar1 * dVar1;
    auVar2 = vfmadd213sd_fma(auVar3,auVar5,auVar7);
    sumSquared = auVar2._0_8_;
  }
  *outSumDerivatives = sum;
  *outSumSquaredDerivatives = sumSquared;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}